

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void AdditionHelper<char,_long_long,_11>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,longlong *rhs,char *result)

{
  int64_t tmp;
  longlong local_28;
  long local_20;
  long local_18;
  
  local_18 = 0;
  local_20 = (long)*lhs;
  local_28 = *rhs;
  AdditionHelper<long,_long,_10>::
  AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_20,&local_28,&local_18)
  ;
  if ((char)local_18 == local_18) {
    *result = (char)local_18;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //rhs is std::int64_t, lhs signed
        std::int64_t tmp = 0;

        AdditionHelper< std::int64_t, std::int64_t, AdditionState_CastInt64CheckOverflow >::AdditionThrow< E >( (std::int64_t)lhs, (std::int64_t)rhs, tmp );

        if( tmp <= std::numeric_limits<T>::max() &&
            tmp >= std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }